

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O1

void print_net(string *tag,Net *xorNet,LabeledDataset *dataset)

{
  ostream *poVar1;
  Array *pAVar2;
  float *__dest;
  pointer pvVar3;
  ulong __n;
  pointer inputs;
  byte bVar4;
  bool bVar5;
  Array out;
  PlainTextNetworkWriter local_90;
  Net *local_88;
  Array local_80;
  char local_70 [16];
  pointer local_60;
  pointer local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_90.out = (ostream *)&std::cout;
  local_88 = xorNet;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(tag->_M_dataplus)._M_p,tag->_M_string_length);
  local_80._M_size = (size_t)local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80," net:\n\n","");
  std::__ostream_insert<char,std::char_traits<char>>
            (local_90.out,(char *)local_80._M_size,(long)local_80._M_data);
  notch::io::PlainTextNetworkWriter::save(&local_90,local_88);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\n","");
  std::__ostream_insert<char,std::char_traits<char>>(local_90.out,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((char *)local_80._M_size != local_70) {
    operator_delete((void *)local_80._M_size);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(tag->_M_dataplus)._M_p,tag->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," out:\n",6);
  inputs = (dataset->inputs).
           super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = (dataset->inputs).
             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (dataset->outputs).
           super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60 = (dataset->outputs).
             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = inputs == local_58;
  while ((bVar5 & pvVar3 == local_60) == 0) {
    pAVar2 = notch::core::Net::output(local_88,inputs);
    local_80._M_size = pAVar2->_M_size;
    __n = local_80._M_size << 2;
    __dest = (float *)operator_new(__n);
    local_80._M_data = __dest;
    if (pAVar2->_M_data != (float *)0x0) {
      memcpy(__dest,pAVar2->_M_data,__n);
    }
    notch::io::operator<<((ostream *)&std::cout,inputs);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -> ",4);
    notch::io::operator<<((ostream *)&std::cout,&local_80);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    operator_delete(__dest);
    bVar4 = ~bVar5 & pvVar3 != local_60;
    inputs = inputs + bVar4;
    pvVar3 = pvVar3 + bVar4;
    bVar5 = inputs == local_58;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void print_net(string tag, Net &xorNet, LabeledDataset dataset) {
    PlainTextNetworkWriter(cout) << tag << " net:\n\n" << xorNet << "\n";
    cout << tag << " out:\n";
    for (auto s : dataset) {
        auto out = xorNet.output(s.data);
        cout << s.data << " -> " << out << "\n";
    }
    cout << "\n";
}